

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O1

void __thiscall
pstd::vector<double,_pstd::pmr::polymorphic_allocator<double>_>::resize
          (vector<double,_pstd::pmr::polymorphic_allocator<double>_> *this,size_type n)

{
  memory_resource *pmVar1;
  ulong uVar2;
  
  if (n < this->nStored) {
    if (n == 0) {
      if (this->ptr != (double *)0x0) {
        pmVar1 = (this->alloc).memoryResource;
        (*pmVar1->_vptr_memory_resource[3])(pmVar1,this->ptr,this->nAlloc << 3,8);
      }
      this->ptr = (double *)0x0;
      this->nAlloc = 0;
    }
  }
  else if (this->nStored < n) {
    reserve(this,n);
    uVar2 = this->nStored;
    if (uVar2 <= n && n - uVar2 != 0) {
      memset(this->ptr + uVar2,0,(n - uVar2) * 8);
    }
  }
  this->nStored = n;
  return;
}

Assistant:

void resize(size_type n) {
        if (n < size()) {
            for (size_t i = n; i < size(); ++i)
                alloc.destroy(ptr + i);
            if (n == 0) {
                alloc.deallocate_object(ptr, nAlloc);
                ptr = nullptr;
                nAlloc = 0;
            }
        } else if (n > size()) {
            reserve(n);
            for (size_t i = nStored; i < n; ++i)
                alloc.construct(ptr + i);
        }
        nStored = n;
    }